

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_tests.cpp
# Opt level: O2

void __thiscall
bloom_tests::merkle_block_4_test_p2pubkey_only::test_method(merkle_block_4_test_p2pubkey_only *this)

{
  long lVar1;
  bool bVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  Span<const_std::byte> sp;
  Span<const_unsigned_char> vKey;
  Span<const_unsigned_char> vKey_00;
  const_string file;
  const_string file_00;
  string_view hex;
  const_string file_01;
  string_view hex_00;
  check_type cVar5;
  undefined1 *local_c10;
  undefined1 *local_c08;
  char *local_c00;
  char *local_bf8;
  char *local_bf0;
  char *local_be8;
  undefined1 *local_be0;
  undefined1 *local_bd8;
  char *local_bd0;
  char *local_bc8;
  char *local_bc0;
  char *local_bb8;
  char *local_bb0;
  char *local_ba8;
  lazy_ostream local_ba0;
  undefined1 *local_b90;
  char **local_b88;
  assertion_result local_b80;
  undefined1 *local_b68;
  undefined1 *local_b60;
  char *local_b58;
  char *local_b50;
  DataStream stream;
  CBloomFilter filter;
  _Storage<transaction_identifier<false>,_true> local_af9;
  char local_ad9;
  COutPoint local_ad8;
  CMerkleBlock merkleBlock;
  CBlock block;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CBlock::CBlock(&block);
  memcpy(&merkleBlock,null_ARRAY_00b66fe0,0x9f2);
  sp.m_size = 0x9f2;
  sp.m_data = (byte *)&merkleBlock;
  DataStream::DataStream(&stream,sp);
  merkleBlock.header._0_8_ = &::TX_WITH_WITNESS;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ = &block;
  ParamsWrapper<TransactionSerParams,_CBlock>::Unserialize<DataStream>
            ((ParamsWrapper<TransactionSerParams,_CBlock> *)&merkleBlock,&stream);
  CBloomFilter::CBloomFilter(&filter,10,1e-06,0,'\x02');
  memcpy(&merkleBlock,util::hex_literals::detail::Hex<131ul>{std::array<std::byte_65ul>,0x41);
  vKey.m_size = 0x41;
  vKey.m_data = (uchar *)&merkleBlock;
  CBloomFilter::insert(&filter,vKey);
  merkleBlock.header.nVersion = 0xdd8efb6;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = 0x99;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\x17';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = 0x9f;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = 'O';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = 'O';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = 0xf6;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = 0xf4;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = 0xdd;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\n';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '}';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\x01';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = 0x8c;
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '8';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = ']';
  merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '!';
  vKey_00.m_size = 0x14;
  vKey_00.m_data = (uchar *)&merkleBlock;
  CBloomFilter::insert(&filter,vKey_00);
  CMerkleBlock::CMerkleBlock(&merkleBlock,&block,&filter);
  local_b58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_b50 = "";
  local_b68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b60 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x1aa;
  file.m_begin = (iterator)&local_b58;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_b68,msg);
  CBlockHeader::GetHash((uint256 *)&local_ad8,&merkleBlock.header);
  CBlockHeader::GetHash(&local_af9._M_value.m_wrapped,&block.super_CBlockHeader);
  local_b80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ::operator==((base_blob<256U> *)&local_ad8,(base_blob<256U> *)&local_af9._M_value);
  local_b80.m_message.px = (element_type *)0x0;
  local_b80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_bb0 = "merkleBlock.header.GetHash() == block.GetHash()";
  local_ba8 = "";
  local_ba0.m_empty = false;
  local_ba0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_b90 = boost::unit_test::lazy_ostream::inst;
  local_bc0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_bb8 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_b88 = &local_bb0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b80,&local_ba0,1,0,WARN,_cVar5,(size_t)&local_bc0,0x1aa);
  boost::detail::shared_count::~shared_count(&local_b80.m_message.pn);
  local_bd0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_bc8 = "";
  local_be0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_bd8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  file_00.m_end = (iterator)0x1ad;
  file_00.m_begin = (iterator)&local_bd0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_be0,
             msg_00);
  hex._M_str = "147caa76786596590baa4e98f5d9f48b86c7765e489f7a6ff3360fe5c674360b";
  hex._M_len = 0x40;
  transaction_identifier<false>::FromHex
            ((optional<transaction_identifier<false>_> *)&local_af9._M_value,hex);
  if (local_ad9 == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] =
         local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10];
    local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
         local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11];
    local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
         local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12];
    local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
         local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13];
    local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
         local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14];
    local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
         local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15];
    local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
         local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16];
    local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
         local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17];
    local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] =
         local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18];
    local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
         local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19];
    local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
         local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a];
    local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
         local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b];
    local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] =
         local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c];
    local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
         local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d];
    local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
         local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e];
    local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
         local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f];
    local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] =
         local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0];
    local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] =
         local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[1];
    local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] =
         local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[2];
    local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] =
         local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[3];
    local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] =
         local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[4];
    local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] =
         local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[5];
    local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] =
         local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[6];
    local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] =
         local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[7];
    local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] =
         local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[8];
    local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] =
         local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[9];
    local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] =
         local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[10];
    local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] =
         local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb];
    local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] =
         local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc];
    local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] =
         local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd];
    local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] =
         local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe];
    local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] =
         local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf];
    local_ad8.n = 0;
    local_b80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)CBloomFilter::contains(&filter,&local_ad8);
    local_b80.m_message.px = (element_type *)0x0;
    local_b80.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_bb0 = 
    "filter.contains(COutPoint(Txid::FromHex(\"147caa76786596590baa4e98f5d9f48b86c7765e489f7a6ff3360fe5c674360b\").value(), 0))"
    ;
    local_ba8 = "";
    local_ba0.m_empty = false;
    local_ba0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
    local_b90 = boost::unit_test::lazy_ostream::inst;
    local_bf0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
    ;
    local_be8 = "";
    pvVar3 = &DAT_00000001;
    pvVar4 = (iterator)0x0;
    local_b88 = &local_bb0;
    boost::test_tools::tt_detail::report_assertion
              (&local_b80,&local_ba0,1,0,WARN,_cVar5,(size_t)&local_bf0,0x1ad);
    boost::detail::shared_count::~shared_count(&local_b80.m_message.pn);
    local_c00 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
    ;
    local_bf8 = "";
    local_c10 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c08 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_01.m_end = pvVar4;
    msg_01.m_begin = pvVar3;
    file_01.m_end = (iterator)0x1af;
    file_01.m_begin = (iterator)&local_c00;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_c10,
               msg_01);
    hex_00._M_str = "02981fa052f0481dbc5868f4fc2166035a10f27a03cfd2de67326471df5bc041";
    hex_00._M_len = 0x40;
    transaction_identifier<false>::FromHex
              ((optional<transaction_identifier<false>_> *)&local_af9._M_value,hex_00);
    if (local_ad9 == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        std::__throw_bad_optional_access();
      }
    }
    else {
      local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] =
           local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10];
      local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
           local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11];
      local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
           local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12];
      local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
           local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13];
      local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
           local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14];
      local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
           local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15];
      local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
           local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16];
      local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
           local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17];
      local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] =
           local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18];
      local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
           local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19];
      local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
           local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a];
      local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
           local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b];
      local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] =
           local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c];
      local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
           local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d];
      local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
           local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e];
      local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
           local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f];
      local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] =
           local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0];
      local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] =
           local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[1];
      local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] =
           local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[2];
      local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] =
           local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[3];
      local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] =
           local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[4];
      local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] =
           local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[5];
      local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] =
           local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[6];
      local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] =
           local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[7];
      local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] =
           local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[8];
      local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] =
           local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[9];
      local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] =
           local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[10];
      local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] =
           local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb];
      local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] =
           local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc];
      local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] =
           local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd];
      local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] =
           local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe];
      local_ad8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] =
           local_af9._M_value.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf];
      local_ad8.n = 0;
      bVar2 = CBloomFilter::contains(&filter,&local_ad8);
      local_b80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)!bVar2;
      local_b80.m_message.px = (element_type *)0x0;
      local_b80.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_bb0 = 
      "!filter.contains(COutPoint(Txid::FromHex(\"02981fa052f0481dbc5868f4fc2166035a10f27a03cfd2de67326471df5bc041\").value(), 0))"
      ;
      local_ba8 = "";
      local_ba0.m_empty = false;
      local_ba0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
      local_b90 = boost::unit_test::lazy_ostream::inst;
      local_b88 = &local_bb0;
      boost::test_tools::tt_detail::report_assertion
                (&local_b80,&local_ba0,1,0,WARN,0xb6556c,(size_t)&stack0xfffffffffffff3e0,0x1af);
      boost::detail::shared_count::~shared_count(&local_b80.m_message.pn);
      CMerkleBlock::~CMerkleBlock(&merkleBlock);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&filter);
      std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&stream);
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::~vector(&block.vtx);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(merkle_block_4_test_p2pubkey_only)
{
    // Random real block (000000000000b731f2eef9e8c63173adfb07e41bd53eb0ef0a6b720d6cb6dea4)
    // With 7 txes
    CBlock block;
    DataStream stream{
        "0100000082bb869cf3a793432a66e826e05a6fc37469f8efb7421dc880670100000000007f16c5962e8bd963659c793ce370d95f093bc7e367117b3c30c1f8fdd0d9728776381b4d4c86041b554b85290701000000010000000000000000000000000000000000000000000000000000000000000000ffffffff07044c86041b0136ffffffff0100f2052a01000000434104eaafc2314def4ca98ac970241bcab022b9c1e1f4ea423a20f134c876f2c01ec0f0dd5b2e86e7168cefe0d81113c3807420ce13ad1357231a2252247d97a46a91ac000000000100000001bcad20a6a29827d1424f08989255120bf7f3e9e3cdaaa6bb31b0737fe048724300000000494830450220356e834b046cadc0f8ebb5a8a017b02de59c86305403dad52cd77b55af062ea10221009253cd6c119d4729b77c978e1e2aa19f5ea6e0e52b3f16e32fa608cd5bab753901ffffffff02008d380c010000001976a9142b4b8072ecbba129b6453c63e129e643207249ca88ac0065cd1d000000001976a9141b8dd13b994bcfc787b32aeadf58ccb3615cbd5488ac000000000100000003fdacf9b3eb077412e7a968d2e4f11b9a9dee312d666187ed77ee7d26af16cb0b000000008c493046022100ea1608e70911ca0de5af51ba57ad23b9a51db8d28f82c53563c56a05c20f5a87022100a8bdc8b4a8acc8634c6b420410150775eb7f2474f5615f7fccd65af30f310fbf01410465fdf49e29b06b9a1582287b6279014f834edc317695d125ef623c1cc3aaece245bd69fcad7508666e9c74a49dc9056d5fc14338ef38118dc4afae5fe2c585caffffffff309e1913634ecb50f3c4f83e96e70b2df071b497b8973a3e75429df397b5af83000000004948304502202bdb79c596a9ffc24e96f4386199aba386e9bc7b6071516e2b51dda942b3a1ed022100c53a857e76b724fc14d45311eac5019650d415c3abb5428f3aae16d8e69bec2301ffffffff2089e33491695080c9edc18a428f7d834db5b6d372df13ce2b1b0e0cbcb1e6c10000000049483045022100d4ce67c5896ee251c810ac1ff9ceccd328b497c8f553ab6e08431e7d40bad6b5022033119c0c2b7d792d31f1187779c7bd95aefd93d90a715586d73801d9b47471c601ffffffff0100714460030000001976a914c7b55141d097ea5df7a0ed330cf794376e53ec8d88ac0000000001000000045bf0e214aa4069a3e792ecee1e1bf0c1d397cde8dd08138f4b72a00681743447000000008b48304502200c45de8c4f3e2c1821f2fc878cba97b1e6f8807d94930713aa1c86a67b9bf1e40221008581abfef2e30f957815fc89978423746b2086375ca8ecf359c85c2a5b7c88ad01410462bb73f76ca0994fcb8b4271e6fb7561f5c0f9ca0cf6485261c4a0dc894f4ab844c6cdfb97cd0b60ffb5018ffd6238f4d87270efb1d3ae37079b794a92d7ec95ffffffffd669f7d7958d40fc59d2253d88e0f248e29b599c80bbcec344a83dda5f9aa72c000000008a473044022078124c8beeaa825f9e0b30bff96e564dd859432f2d0cb3b72d3d5d93d38d7e930220691d233b6c0f995be5acb03d70a7f7a65b6bc9bdd426260f38a1346669507a3601410462bb73f76ca0994fcb8b4271e6fb7561f5c0f9ca0cf6485261c4a0dc894f4ab844c6cdfb97cd0b60ffb5018ffd6238f4d87270efb1d3ae37079b794a92d7ec95fffffffff878af0d93f5229a68166cf051fd372bb7a537232946e0a46f53636b4dafdaa4000000008c493046022100c717d1714551663f69c3c5759bdbb3a0fcd3fab023abc0e522fe6440de35d8290221008d9cbe25bffc44af2b18e81c58eb37293fd7fe1c2e7b46fc37ee8c96c50ab1e201410462bb73f76ca0994fcb8b4271e6fb7561f5c0f9ca0cf6485261c4a0dc894f4ab844c6cdfb97cd0b60ffb5018ffd6238f4d87270efb1d3ae37079b794a92d7ec95ffffffff27f2b668859cd7f2f894aa0fd2d9e60963bcd07c88973f425f999b8cbfd7a1e2000000008c493046022100e00847147cbf517bcc2f502f3ddc6d284358d102ed20d47a8aa788a62f0db780022100d17b2d6fa84dcaf1c95d88d7e7c30385aecf415588d749afd3ec81f6022cecd701410462bb73f76ca0994fcb8b4271e6fb7561f5c0f9ca0cf6485261c4a0dc894f4ab844c6cdfb97cd0b60ffb5018ffd6238f4d87270efb1d3ae37079b794a92d7ec95ffffffff0100c817a8040000001976a914b6efd80d99179f4f4ff6f4dd0a007d018c385d2188ac000000000100000001834537b2f1ce8ef9373a258e10545ce5a50b758df616cd4356e0032554ebd3c4000000008b483045022100e68f422dd7c34fdce11eeb4509ddae38201773dd62f284e8aa9d96f85099d0b002202243bd399ff96b649a0fad05fa759d6a882f0af8c90cf7632c2840c29070aec20141045e58067e815c2f464c6a2a15f987758374203895710c2d452442e28496ff38ba8f5fd901dc20e29e88477167fe4fc299bf818fd0d9e1632d467b2a3d9503b1aaffffffff0280d7e636030000001976a914f34c3e10eb387efe872acb614c89e78bfca7815d88ac404b4c00000000001976a914a84e272933aaf87e1715d7786c51dfaeb5b65a6f88ac00000000010000000143ac81c8e6f6ef307dfe17f3d906d999e23e0189fda838c5510d850927e03ae7000000008c4930460221009c87c344760a64cb8ae6685a3eec2c1ac1bed5b88c87de51acd0e124f266c16602210082d07c037359c3a257b5c63ebd90f5a5edf97b2ac1c434b08ca998839f346dd40141040ba7e521fa7946d12edbb1d1e95a15c34bd4398195e86433c92b431cd315f455fe30032ede69cad9d1e1ed6c3c4ec0dbfced53438c625462afb792dcb098544bffffffff0240420f00000000001976a9144676d1b820d63ec272f1900d59d43bc6463d96f888ac40420f00000000001976a914648d04341d00d7968b3405c034adc38d4d8fb9bd88ac00000000010000000248cc917501ea5c55f4a8d2009c0567c40cfe037c2e71af017d0a452ff705e3f1000000008b483045022100bf5fdc86dc5f08a5d5c8e43a8c9d5b1ed8c65562e280007b52b133021acd9acc02205e325d613e555f772802bf413d36ba807892ed1a690a77811d3033b3de226e0a01410429fa713b124484cb2bd7b5557b2c0b9df7b2b1fee61825eadc5ae6c37a9920d38bfccdc7dc3cb0c47d7b173dbc9db8d37db0a33ae487982c59c6f8606e9d1791ffffffff41ed70551dd7e841883ab8f0b16bf04176b7d1480e4f0af9f3d4c3595768d068000000008b4830450221008513ad65187b903aed1102d1d0c47688127658c51106753fed0151ce9c16b80902201432b9ebcb87bd04ceb2de66035fbbaf4bf8b00d1cfe41f1a1f7338f9ad79d210141049d4cf80125bf50be1709f718c07ad15d0fc612b7da1f5570dddc35f2a352f0f27c978b06820edca9ef982c35fda2d255afba340068c5035552368bc7200c1488ffffffff0100093d00000000001976a9148edb68822f1ad580b043c7b3df2e400f8699eb4888ac00000000"_hex,
    };
    stream >> TX_WITH_WITNESS(block);

    CBloomFilter filter(10, 0.000001, 0, BLOOM_UPDATE_P2PUBKEY_ONLY);
    // Match the generation pubkey
    filter.insert("04eaafc2314def4ca98ac970241bcab022b9c1e1f4ea423a20f134c876f2c01ec0f0dd5b2e86e7168cefe0d81113c3807420ce13ad1357231a2252247d97a46a91"_hex_u8);
    // ...and the output address of the 4th transaction
    filter.insert("b6efd80d99179f4f4ff6f4dd0a007d018c385d21"_hex_u8);

    CMerkleBlock merkleBlock(block, filter);
    BOOST_CHECK(merkleBlock.header.GetHash() == block.GetHash());

    // We should match the generation outpoint
    BOOST_CHECK(filter.contains(COutPoint(Txid::FromHex("147caa76786596590baa4e98f5d9f48b86c7765e489f7a6ff3360fe5c674360b").value(), 0)));
    // ... but not the 4th transaction's output (its not pay-2-pubkey)
    BOOST_CHECK(!filter.contains(COutPoint(Txid::FromHex("02981fa052f0481dbc5868f4fc2166035a10f27a03cfd2de67326471df5bc041").value(), 0)));
}